

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O1

void __thiscall
OptionRecordString::OptionRecordString
          (OptionRecordString *this,string *Xname,string *Xdescription,bool Xadvanced,
          string *Xvalue_pointer,string *Xdefault_value)

{
  pointer pcVar1;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (Xname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + Xname->_M_string_length);
  pcVar1 = (Xdescription->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + Xdescription->_M_string_length);
  OptionRecord::OptionRecord(&this->super_OptionRecord,kString,&local_70,&local_50,Xadvanced);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_OptionRecord)._vptr_OptionRecord = (_func_int **)&PTR__OptionRecordString_00159568;
  (this->default_value)._M_dataplus._M_p = (pointer)&(this->default_value).field_2;
  (this->default_value)._M_string_length = 0;
  (this->default_value).field_2._M_local_buf[0] = '\0';
  this->value = Xvalue_pointer;
  std::__cxx11::string::_M_assign((string *)&this->default_value);
  std::__cxx11::string::_M_assign((string *)this->value);
  return;
}

Assistant:

OptionRecordString(std::string Xname, std::string Xdescription,
                     bool Xadvanced, std::string* Xvalue_pointer,
                     std::string Xdefault_value)
      : OptionRecord(HighsOptionType::kString, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    default_value = Xdefault_value;
    *value = default_value;
  }